

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::FileOptions::_InternalParse(FileOptions *this,char *ptr,ParseContext *ctx)

{
  byte *pbVar1;
  bool bVar2;
  UninterpretedOption *msg;
  string *s;
  uint64 uVar3;
  UnknownFieldSet *this_00;
  uint uVar4;
  char cVar5;
  char *local_50;
  uint32 tag;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  uVar4 = 0;
  local_50 = ptr;
LAB_002b0e22:
LAB_002b0e27:
  bVar2 = internal::ParseContext::Done(ctx,&local_50);
  if (bVar2) goto LAB_002b11e7;
  local_50 = internal::ReadTag(local_50,&tag,0);
  if (local_50 == (char *)0x0) goto LAB_002b1201;
  cVar5 = (char)tag;
  switch(tag >> 3) {
  case 1:
    if (cVar5 != '\n') break;
    s = _internal_mutable_java_package_abi_cxx11_(this);
LAB_002b10f4:
    local_50 = internal::InlineGreedyStringParser(s,local_50,ctx);
    goto joined_r0x002b113b;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x26:
  case 0x2b:
    break;
  case 8:
    if (cVar5 == 'B') {
      s = _internal_mutable_java_outer_classname_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 9:
    if (cVar5 == 'H') goto LAB_002b119a;
    break;
  case 10:
    if (cVar5 == 'P') {
      uVar4 = uVar4 | 0x400;
      uVar3 = internal::ReadVarint(&local_50);
      this->java_multiple_files_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0xb:
    if (cVar5 == 'Z') {
      s = _internal_mutable_go_package_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x10:
    break;
  case 0x11:
    if (cVar5 == -0x78) {
      uVar4 = uVar4 | 0x4000;
      uVar3 = internal::ReadVarint(&local_50);
      this->java_generic_services_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x12:
    if (cVar5 == -0x70) {
      uVar4 = uVar4 | 0x8000;
      uVar3 = internal::ReadVarint(&local_50);
      this->py_generic_services_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x14:
    if (cVar5 == -0x60) {
      uVar4 = uVar4 | 0x800;
      uVar3 = internal::ReadVarint(&local_50);
      this->java_generate_equals_and_hash_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x17:
    if (cVar5 == -0x48) {
      uVar4 = uVar4 | 0x20000;
      uVar3 = internal::ReadVarint(&local_50);
      this->deprecated_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x1b:
    if (cVar5 == -0x28) {
      uVar4 = uVar4 | 0x1000;
      uVar3 = internal::ReadVarint(&local_50);
      this->java_string_check_utf8_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x1f:
    if (cVar5 == -8) {
      uVar4 = uVar4 | 0x40000;
      uVar3 = internal::ReadVarint(&local_50);
      this->cc_enable_arenas_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x24:
    if (cVar5 == '\"') {
      s = _internal_mutable_objc_class_prefix_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x25:
    if (cVar5 == '*') {
      s = _internal_mutable_csharp_namespace_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x27:
    if (cVar5 == ':') {
      s = _internal_mutable_swift_prefix_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x28:
    if (cVar5 == 'B') {
      s = _internal_mutable_php_class_prefix_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x29:
    if (cVar5 == 'J') {
      s = _internal_mutable_php_namespace_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x2a:
    if (cVar5 == 'P') {
      uVar4 = uVar4 | 0x10000;
      uVar3 = internal::ReadVarint(&local_50);
      this->php_generic_services_ = uVar3 != 0;
      goto joined_r0x002b113b;
    }
    break;
  case 0x2c:
    if (cVar5 == 'b') {
      s = _internal_mutable_php_metadata_namespace_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  case 0x2d:
    if (cVar5 == 'j') {
      s = _internal_mutable_ruby_package_abi_cxx11_(this);
      goto LAB_002b10f4;
    }
    break;
  default:
    if ((tag >> 3 != 999) || (cVar5 != ':')) break;
    local_50 = local_50 + -2;
    do {
      local_50 = local_50 + 2;
      msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                      (&this->uninterpreted_option_);
      local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                           (ctx,msg,local_50);
      if (local_50 == (char *)0x0) goto LAB_002b1201;
    } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
            (bVar2 = internal::ExpectTag<7994u>(local_50), bVar2));
    goto LAB_002b0e27;
  }
  if (((ulong)tag == 0) || ((tag & 7) == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
    goto LAB_002b11e7;
  }
  if (tag < 8000) {
    local_50 = internal::UnknownFieldParse(tag,local_40,local_50,ctx);
  }
  else {
    local_50 = internal::ExtensionSet::ParseField
                         (local_38,(ulong)tag,local_50,(Message *)_FileOptions_default_instance_,
                          local_40,ctx);
  }
joined_r0x002b113b:
  if (local_50 == (char *)0x0) goto LAB_002b1201;
  goto LAB_002b0e27;
LAB_002b119a:
  uVar3 = internal::ReadVarint(&local_50);
  if (local_50 == (char *)0x0) {
LAB_002b1201:
    local_50 = (char *)0x0;
LAB_002b11e7:
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
    return local_50;
  }
  if ((int)uVar3 - 1U < 3) {
    pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
    *pbVar1 = *pbVar1 | 8;
    this->optimize_for_ = (int)uVar3;
  }
  else {
    this_00 = mutable_unknown_fields(this);
    UnknownFieldSet::AddVarint(this_00,9,uVar3);
  }
  goto LAB_002b0e22;
}

Assistant:

const char* FileOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string java_package = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_package(), ptr, ctx, "google.protobuf.FileOptions.java_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string java_outer_classname = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_outer_classname(), ptr, ctx, "google.protobuf.FileOptions.java_outer_classname");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode_IsValid(val))) {
            _internal_set_optimize_for(static_cast<PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(9, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool java_multiple_files = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_java_multiple_files(&has_bits);
          java_multiple_files_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string go_package = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_go_package(), ptr, ctx, "google.protobuf.FileOptions.go_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_generic_services = 16 [default = false];
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 128)) {
          _Internal::set_has_cc_generic_services(&has_bits);
          cc_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generic_services = 17 [default = false];
      case 17:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 136)) {
          _Internal::set_has_java_generic_services(&has_bits);
          java_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool py_generic_services = 18 [default = false];
      case 18:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 144)) {
          _Internal::set_has_py_generic_services(&has_bits);
          py_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 160)) {
          _Internal::set_has_java_generate_equals_and_hash(&has_bits);
          java_generate_equals_and_hash_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 23 [default = false];
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 184)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 216)) {
          _Internal::set_has_java_string_check_utf8(&has_bits);
          java_string_check_utf8_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_enable_arenas = 31 [default = false];
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 248)) {
          _Internal::set_has_cc_enable_arenas(&has_bits);
          cc_enable_arenas_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string objc_class_prefix = 36;
      case 36:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_objc_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.objc_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string csharp_namespace = 37;
      case 37:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_csharp_namespace(), ptr, ctx, "google.protobuf.FileOptions.csharp_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string swift_prefix = 39;
      case 39:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_swift_prefix(), ptr, ctx, "google.protobuf.FileOptions.swift_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_class_prefix = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.php_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_namespace = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool php_generic_services = 42 [default = false];
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_php_generic_services(&has_bits);
          php_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_metadata_namespace = 44;
      case 44:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_metadata_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_metadata_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string ruby_package = 45;
      case 45:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_ruby_package(), ptr, ctx, "google.protobuf.FileOptions.ruby_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}